

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_receive(Plug *plug,int urgent,char *data,size_t len)

{
  Ssh *ssh;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  if (plug[7].vt != (PlugVtable *)0x0) {
    log_packet((LogContext *)plug[7].vt,0,-1,(char *)0x0,data,len,0,(logblank_t *)0x0,
               (unsigned_long *)0x0,0,(char *)0x0);
  }
  bufchain_add((bufchain *)(plug + 0x19),data,len);
  if ((((ulong)plug[0x17].vt & 0x100) == 0) && (plug[0x32].vt != (PlugVtable *)0x0)) {
    queue_idempotent_callback((IdempotentCallback *)&plug[0x32].vt[4].closing);
  }
  ssh_check_frozen((Ssh *)(plug + -5));
  return;
}

Assistant:

static void ssh_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    Ssh *ssh = container_of(plug, Ssh, plug);

    /* Log raw data, if we're in that mode. */
    if (ssh->logctx)
        log_packet(ssh->logctx, PKT_INCOMING, -1, NULL, data, len,
                   0, NULL, NULL, 0, NULL);

    bufchain_add(&ssh->in_raw, data, len);
    if (!ssh->logically_frozen && ssh->bpp)
        queue_idempotent_callback(&ssh->bpp->ic_in_raw);

    ssh_check_frozen(ssh);
}